

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteSpherical.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkRevoluteSpherical::Initialize
          (ChLinkRevoluteSpherical *this,shared_ptr<chrono::ChBody> *body1,
          shared_ptr<chrono::ChBody> *body2,bool local,ChVector<double> *pos1,ChVector<double> *dir1
          ,ChVector<double> *pos2,bool auto_distance,double distance)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  element_type *peVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  bool bVar19;
  int iVar20;
  int iVar21;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined7 in_register_00000009;
  ChBodyFrame *pCVar22;
  ChBodyFrame *pCVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  double dVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  double dVar61;
  double dVar62;
  double local_48;
  double local_40;
  double local_38;
  
  peVar11 = (body1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar23 = &peVar11->super_ChBodyFrame;
  if (peVar11 == (element_type *)0x0) {
    pCVar23 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body1 = pCVar23;
  peVar11 = (body2->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar22 = &peVar11->super_ChBodyFrame;
  if (peVar11 == (element_type *)0x0) {
    pCVar22 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body2 = pCVar22;
  iVar20 = (*(pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  iVar21 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dist,(ChVariables *)CONCAT44(extraout_var,iVar20),
             (ChVariables *)CONCAT44(extraout_var_00,iVar21));
  iVar20 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  iVar21 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dot,(ChVariables *)CONCAT44(extraout_var_01,iVar20),
             (ChVariables *)CONCAT44(extraout_var_02,iVar21));
  if ((int)CONCAT71(in_register_00000009,local) == 0) {
    dVar1 = dir1->m_data[1];
    auVar38._8_8_ = 0;
    auVar38._0_8_ = dir1->m_data[0];
    auVar41._8_8_ = 0;
    auVar41._0_8_ = dir1->m_data[2];
    dVar61 = pos1->m_data[1];
    dVar33 = pos1->m_data[0];
    dVar62 = pos1->m_data[2];
    local_48 = pos2->m_data[0];
    local_40 = pos2->m_data[1];
    local_38 = pos2->m_data[2];
    auVar36._8_8_ = 0;
    auVar36._0_8_ = dVar1 * dVar1;
    auVar16 = vfmadd231sd_fma(auVar36,auVar38,auVar38);
    auVar16 = vfmadd231sd_fma(auVar16,auVar41,auVar41);
    auVar16 = vsqrtsd_avx(auVar16,auVar16);
    bVar19 = 2.2250738585072014e-308 <= auVar16._0_8_;
    pCVar23 = (this->super_ChLink).Body1;
    dVar48 = 1.0 / auVar16._0_8_;
    dVar12 = dVar61 - (pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data
                      [1];
    auVar56._0_8_ =
         dVar12 * (pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[3];
    auVar56._8_8_ =
         dVar12 * (pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4];
    dVar13 = dVar33 - (pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data
                      [0];
    auVar24._0_8_ =
         (ulong)bVar19 * (long)(dir1->m_data[0] * dVar48) + (ulong)!bVar19 * 0x3ff0000000000000;
    auVar24._8_8_ = 0;
    dVar14 = (double)((ulong)bVar19 * (long)(dVar1 * dVar48));
    uVar15 = (ulong)bVar19 * (long)(dir1->m_data[2] * dVar48);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar15;
    dVar1 = dVar62 - (pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data
                     [2];
    auVar16._8_8_ = 0;
    auVar16._0_8_ =
         (pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar50._8_8_ = 0;
    auVar50._0_8_ = dVar13;
    auVar59._8_8_ = 0;
    auVar59._0_8_ =
         dVar12 * (pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[5];
    auVar16 = vfmadd231sd_fma(auVar59,auVar50,auVar16);
    auVar17._8_8_ = 0;
    auVar17._0_8_ =
         (pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar42._8_8_ = 0;
    auVar42._0_8_ = dVar1;
    auVar17 = vfmadd231sd_fma(auVar16,auVar42,auVar17);
    auVar51._8_8_ = dVar13;
    auVar51._0_8_ = dVar13;
    auVar16 = vfmadd132pd_fma(auVar51,auVar56,
                              *(undefined1 (*) [16])
                               (pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                               super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array);
    auVar43._8_8_ = dVar1;
    auVar43._0_8_ = dVar1;
    auVar16 = vfmadd132pd_fma(auVar43,auVar16,
                              *(undefined1 (*) [16])
                               ((pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix
                                .super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 6));
    *(undefined1 (*) [16])(this->m_pos1).m_data = auVar16;
    (this->m_pos1).m_data[2] = auVar17._0_8_;
    pCVar22 = (this->super_ChLink).Body2;
    dVar1 = local_40 -
            (pCVar22->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
    dVar12 = local_48 -
             (pCVar22->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
    dVar13 = local_38 -
             (pCVar22->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
    auVar18._8_8_ = 0;
    auVar18._0_8_ =
         (pCVar22->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar52._8_8_ = 0;
    auVar52._0_8_ = dVar12;
    auVar60._8_8_ = 0;
    auVar60._0_8_ =
         dVar1 * (pCVar22->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
    auVar16 = vfmadd231sd_fma(auVar60,auVar52,auVar18);
    auVar57._0_8_ =
         dVar1 * (pCVar22->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
    auVar57._8_8_ =
         dVar1 * (pCVar22->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
    auVar53._8_8_ = dVar12;
    auVar53._0_8_ = dVar12;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (pCVar22->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8];
    auVar44._8_8_ = 0;
    auVar44._0_8_ = dVar13;
    auVar17 = vfmadd231sd_fma(auVar16,auVar44,auVar8);
    auVar45._8_8_ = dVar13;
    auVar45._0_8_ = dVar13;
    auVar16 = vfmadd132pd_fma(auVar53,auVar57,
                              *(undefined1 (*) [16])
                               (pCVar22->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                               super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array);
    auVar58._8_8_ = auVar24._0_8_;
    auVar58._0_8_ = auVar24._0_8_;
    auVar16 = vfmadd132pd_fma(auVar45,auVar16,
                              *(undefined1 (*) [16])
                               ((pCVar22->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix
                                .super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 6));
    *(undefined1 (*) [16])(this->m_pos2).m_data = auVar16;
    (this->m_pos2).m_data[2] = auVar17._0_8_;
    auVar54._0_8_ =
         dVar14 * (pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[3];
    auVar54._8_8_ =
         dVar14 * (pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4];
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
    auVar46._8_8_ = 0;
    auVar46._0_8_ =
         dVar14 * (pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[5];
    auVar17 = vfmadd231sd_fma(auVar46,auVar24,auVar9);
    auVar16 = vfmadd132pd_fma(auVar58,auVar54,
                              *(undefined1 (*) [16])
                               (pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                               super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array);
    auVar55._8_8_ = uVar15;
    auVar55._0_8_ = uVar15;
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         (pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar17 = vfmadd231sd_fma(auVar17,auVar25,auVar10);
    auVar16 = vfmadd132pd_fma(auVar55,auVar16,
                              *(undefined1 (*) [16])
                               ((pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix
                                .super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 6));
    *(undefined1 (*) [16])(this->m_dir1).m_data = auVar16;
    (this->m_dir1).m_data[2] = auVar17._0_8_;
  }
  else {
    if (&this->m_pos1 != pos1) {
      (this->m_pos1).m_data[0] = pos1->m_data[0];
      (this->m_pos1).m_data[1] = pos1->m_data[1];
      (this->m_pos1).m_data[2] = pos1->m_data[2];
    }
    if (&this->m_pos2 != pos2) {
      (this->m_pos2).m_data[0] = pos2->m_data[0];
      (this->m_pos2).m_data[1] = pos2->m_data[1];
      (this->m_pos2).m_data[2] = pos2->m_data[2];
    }
    dVar1 = dir1->m_data[1];
    auVar29._8_8_ = 0;
    auVar29._0_8_ = dir1->m_data[0];
    dVar61 = dir1->m_data[2];
    auVar26._8_8_ = 0;
    auVar26._0_8_ = dVar61;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = dVar1 * dVar1;
    auVar16 = vfmadd231sd_fma(auVar34,auVar29,auVar29);
    auVar16 = vfmadd231sd_fma(auVar16,auVar26,auVar26);
    auVar16 = vsqrtsd_avx(auVar16,auVar16);
    bVar19 = 2.2250738585072014e-308 <= auVar16._0_8_;
    dVar33 = 1.0 / auVar16._0_8_;
    (this->m_dir1).m_data[0] =
         (double)((ulong)bVar19 * (long)(dir1->m_data[0] * dVar33) +
                 (ulong)!bVar19 * 0x3ff0000000000000);
    (this->m_dir1).m_data[1] = (double)((ulong)bVar19 * (long)(dVar1 * dVar33));
    (this->m_dir1).m_data[2] = (double)((ulong)bVar19 * (long)(dVar61 * dVar33));
    pCVar23 = (this->super_ChLink).Body1;
    ChTransform<double>::TransformLocalToParent
              (&this->m_pos1,&(pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos
               ,&(pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
    pCVar23 = (this->super_ChLink).Body2;
    ChTransform<double>::TransformLocalToParent
              (&this->m_pos2,&(pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos
               ,&(pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
    pCVar23 = (this->super_ChLink).Body1;
    dVar1 = (this->m_dir1).m_data[1];
    auVar40._8_8_ = 0;
    auVar40._0_8_ = (this->m_dir1).m_data[0];
    auVar49._8_8_ = 0;
    auVar49._0_8_ = (this->m_dir1).m_data[2];
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
    auVar35._8_8_ = 0;
    auVar35._0_8_ =
         dVar1 * (pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
    auVar16 = vfmadd231sd_fma(auVar35,auVar40,auVar2);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
    auVar37._8_8_ = 0;
    auVar37._0_8_ =
         dVar1 * (pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
    auVar17 = vfmadd231sd_fma(auVar37,auVar40,auVar3);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[6];
    auVar39._8_8_ = 0;
    auVar39._0_8_ =
         dVar1 * (pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
    auVar18 = vfmadd231sd_fma(auVar39,auVar40,auVar4);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
    auVar24 = vfmadd231sd_fma(auVar16,auVar49,auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[5];
    auVar16 = vfmadd231sd_fma(auVar17,auVar49,auVar6);
    dVar14 = auVar16._0_8_;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8];
    auVar25 = vfmadd231sd_fma(auVar18,auVar49,auVar7);
    dVar61 = local_40;
    dVar33 = local_48;
    dVar62 = local_38;
  }
  dVar61 = local_40 - dVar61;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_48 - dVar33;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar61 * dVar61;
  auVar16 = vfmadd231sd_fma(auVar47,auVar27,auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = local_48 - dVar33;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar14 * dVar61;
  auVar17 = vfmadd231sd_fma(auVar30,auVar28,auVar24);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = local_38 - dVar62;
  auVar16 = vfmadd231sd_fma(auVar16,auVar31,auVar31);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = local_38 - dVar62;
  auVar17 = vfmadd231sd_fma(auVar17,auVar32,auVar25);
  auVar16 = vsqrtsd_avx(auVar16,auVar16);
  this->m_cur_dist = auVar16._0_8_;
  this->m_dist = (double)((ulong)auto_distance * (long)auVar16._0_8_ +
                         (ulong)!auto_distance * (long)distance);
  this->m_cur_dot = auVar17._0_8_;
  return;
}

Assistant:

void ChLinkRevoluteSpherical::Initialize(std::shared_ptr<ChBody> body1,
                                         std::shared_ptr<ChBody> body2,
                                         bool local,
                                         const ChVector<>& pos1,
                                         const ChVector<>& dir1,
                                         const ChVector<>& pos2,
                                         bool auto_distance,
                                         double distance) {
    Body1 = body1.get();
    Body2 = body2.get();

    m_cnstr_dist.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_dot.SetVariables(&Body1->Variables(), &Body2->Variables());

    ChVector<> pos1_abs;
    ChVector<> pos2_abs;
    ChVector<> dir1_abs;

    if (local) {
        m_pos1 = pos1;
        m_pos2 = pos2;
        m_dir1 = Vnorm(dir1);
        pos1_abs = Body1->TransformPointLocalToParent(m_pos1);
        pos2_abs = Body2->TransformPointLocalToParent(m_pos2);
        dir1_abs = Body1->TransformDirectionLocalToParent(m_dir1);
    } else {
        pos1_abs = pos1;
        pos2_abs = pos2;
        dir1_abs = Vnorm(dir1);
        m_pos1 = Body1->TransformPointParentToLocal(pos1_abs);
        m_pos2 = Body2->TransformPointParentToLocal(pos2_abs);
        m_dir1 = Body1->TransformDirectionParentToLocal(dir1_abs);
    }

    ChVector<> d12_abs = pos2_abs - pos1_abs;

    m_cur_dist = d12_abs.Length();
    m_dist = auto_distance ? m_cur_dist : distance;

    m_cur_dot = Vdot(d12_abs, dir1_abs);
}